

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O2

int tr_send_all(tr_socket *socket,void *pdu,size_t len,time_t timeout)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  time_t cur_time;
  time_t end_time;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_get_monotonic_time(&local_40);
  local_40 = local_40 + timeout;
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    uVar1 = uVar2;
    if (len < uVar3 || len - uVar3 == 0) break;
    lrtr_get_monotonic_time(&local_48);
    uVar1 = (*socket->send_fp)(socket->socket,(void *)(uVar3 + (long)pdu),len - uVar3,
                               local_40 - local_48);
    uVar2 = uVar2 + uVar1;
  } while (-1 < (int)uVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

int tr_send_all(const struct tr_socket *socket, const void *pdu, const size_t len, const time_t timeout)
{
	unsigned int total_send = 0;
	time_t end_time;

	lrtr_get_monotonic_time(&end_time);
	end_time = end_time + timeout;

	while (total_send < len) {
		time_t cur_time;
		int rtval;

		lrtr_get_monotonic_time(&cur_time);

		rtval = tr_send(socket, ((char *)pdu) + total_send, (len - total_send), (end_time - cur_time));
		if (rtval < 0)
			return rtval;
		total_send += rtval;
	}
	return total_send;
}